

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_intersection
               (array_container_t *array1,array_container_t *array2,array_container_t *out)

{
  int b;
  int32_t iVar1;
  int32_t iVar2;
  uint uVar3;
  int32_t *in_RDX;
  array_container_t *in_RSI;
  int32_t *in_RDI;
  int threshold;
  int32_t min_card;
  int32_t card_2;
  int32_t card_1;
  uint16_t *in_stack_00000030;
  size_t in_stack_00000038;
  uint16_t *in_stack_00000040;
  uint16_t *in_stack_00000048;
  uint16_t *in_stack_00000050;
  uint16_t *in_stack_00000058;
  size_t in_stack_00000060;
  uint16_t *in_stack_00000068;
  
  iVar2 = *in_RDI;
  b = in_RSI->cardinality;
  iVar1 = minimum_int32(iVar2,b);
  if (in_RDX[1] < iVar1) {
    array_container_grow(in_RSI,(int32_t)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  }
  if (iVar2 * 0x40 < b) {
    iVar2 = intersect_skewed_uint16
                      (in_stack_00000050,(size_t)in_stack_00000048,in_stack_00000040,
                       in_stack_00000038,in_stack_00000030);
    *in_RDX = iVar2;
  }
  else if (b * 0x40 < iVar2) {
    iVar2 = intersect_skewed_uint16
                      (in_stack_00000050,(size_t)in_stack_00000048,in_stack_00000040,
                       in_stack_00000038,in_stack_00000030);
    *in_RDX = iVar2;
  }
  else {
    uVar3 = croaring_hardware_support();
    if ((uVar3 & 1) == 0) {
      iVar2 = intersect_uint16(*(uint16_t **)(in_RDI + 2),(long)iVar2,in_RSI->array,(long)b,
                               *(uint16_t **)(in_RDX + 2));
      *in_RDX = iVar2;
    }
    else {
      iVar2 = intersect_vector16(in_stack_00000068,in_stack_00000060,in_stack_00000058,
                                 (size_t)in_stack_00000050,in_stack_00000048);
      *in_RDX = iVar2;
    }
  }
  return;
}

Assistant:

void array_container_intersection(const array_container_t *array1,
                                  const array_container_t *array2,
                                  array_container_t *out) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality,
            min_card = minimum_int32(card_1, card_2);
    const int threshold = 64;  // subject to tuning
#if CROARING_IS_X64
    if (out->capacity < min_card) {
        array_container_grow(out, min_card + sizeof(__m128i) / sizeof(uint16_t),
                             false);
    }
#else
    if (out->capacity < min_card) {
        array_container_grow(out, min_card, false);
    }
#endif

    if (card_1 * threshold < card_2) {
        out->cardinality = intersect_skewed_uint16(
            array1->array, card_1, array2->array, card_2, out->array);
    } else if (card_2 * threshold < card_1) {
        out->cardinality = intersect_skewed_uint16(
            array2->array, card_2, array1->array, card_1, out->array);
    } else {
#if CROARING_IS_X64
        if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
            out->cardinality = intersect_vector16(
                array1->array, card_1, array2->array, card_2, out->array);
        } else {
            out->cardinality = intersect_uint16(
                array1->array, card_1, array2->array, card_2, out->array);
        }
#else
        out->cardinality = intersect_uint16(array1->array, card_1,
                                            array2->array, card_2, out->array);
#endif
    }
}